

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

ostream * FIX::operator<<(ostream *stream,SessionSettings *sessionSettings)

{
  _Rb_tree_node_base *key;
  bool bVar1;
  __type_conflict1 _Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  Dictionary *pDVar5;
  _Base_ptr p_Var6;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_80;
  string local_50;
  
  if ((sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar3 = std::operator<<(stream,"[DEFAULT]");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (p_Var4 = (sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(sessionSettings->m_defaults).m_data._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::operator<<(stream,(string *)(p_Var4 + 1));
      poVar3 = std::operator<<(poVar3,"=");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 2));
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::endl<char,std::char_traits<char>>(stream);
  }
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_80,sessionSettings);
  p_Var4 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &local_80._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
      ::~_Rb_tree(&local_80);
      return stream;
    }
    poVar3 = std::operator<<(stream,"[SESSION]");
    std::endl<char,std::char_traits<char>>(poVar3);
    pDVar5 = SessionSettings::get(sessionSettings,(SessionID *)(p_Var4 + 1));
    if ((pDVar5->m_data)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      for (p_Var6 = (pDVar5->m_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(pDVar5->m_data)._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        key = p_Var6 + 1;
        bVar1 = Dictionary::has(&sessionSettings->m_defaults,(string *)key);
        if (bVar1) {
          Dictionary::getString(&local_50,&sessionSettings->m_defaults,(string *)key,false);
          _Var2 = std::operator==(&local_50,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var6 + 2));
          std::__cxx11::string::~string((string *)&local_50);
          if (!_Var2) goto LAB_001b9177;
        }
        else {
LAB_001b9177:
          poVar3 = std::operator<<(stream,(string *)key);
          poVar3 = std::operator<<(poVar3,"=");
          poVar3 = std::operator<<(poVar3,(string *)(p_Var6 + 2));
          std::endl<char,std::char_traits<char>>(poVar3);
        }
      }
      std::endl<char,std::char_traits<char>>(stream);
    }
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const SessionSettings &sessionSettings) {
  const Dictionary &defaults = sessionSettings.get();
  if (defaults.size()) {
    stream << "[DEFAULT]" << std::endl;
    for (const Dictionary::value_type &defaultParam : defaults) {
      stream << defaultParam.first << "=" << defaultParam.second << std::endl;
    }
    stream << std::endl;
  }

  for (const SessionID &sessionID : sessionSettings.getSessions()) {
    stream << "[SESSION]" << std::endl;
    const Dictionary &section = sessionSettings.get(sessionID);
    if (!section.size()) {
      continue;
    }

    for (const Dictionary::value_type &sectionParam : section) {
      if (defaults.has(sectionParam.first) && defaults.getString(sectionParam.first) == sectionParam.second) {
        continue;
      }
      stream << sectionParam.first << "=" << sectionParam.second << std::endl;
    }
    stream << std::endl;
  }

  return stream;
}